

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall args::Matcher::Match(Matcher *this,EitherFlag *flag)

{
  bool bVar1;
  
  if (flag->isShort == true) {
    bVar1 = Match(this,flag->shortFlag);
    return bVar1;
  }
  bVar1 = Match(this,&flag->longFlag);
  return bVar1;
}

Assistant:

bool Match(const EitherFlag &flag) const
            {
                return flag.isShort ? Match(flag.shortFlag) : Match(flag.longFlag);
            }